

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_function_helper
          (xpath_parser *this,ast_type_t type0,ast_type_t type1,size_t argc,xpath_ast_node **args)

{
  xpath_lexer *this_00;
  lexeme_t lVar1;
  nodetest_t nVar2;
  xpath_ast_node *pxVar3;
  xpath_lexer_string *pxVar4;
  xpath_ast_node *pxVar5;
  char_t *pcVar6;
  xpath_ast_node *pxVar7;
  xpath_ast_node *pxVar8;
  xpath_ast_node **ppxVar9;
  char cVar10;
  char *pcVar11;
  char *pcVar12;
  char cVar13;
  bool bVar14;
  xpath_lexer_string xStack_70;
  xpath_ast_node *pxStack_60;
  xpath_ast_node **ppxStack_58;
  
  if ((argc != 1) || ((*args)->_rettype == '\x01')) {
    pxVar3 = (xpath_ast_node *)alloc_node(this);
    cVar13 = (char)type1;
    if (argc == 0) {
      cVar13 = (char)type0;
    }
    pxVar5 = *args;
    pxVar3->_type = cVar13;
    pxVar3->_rettype = '\x03';
    pxVar3->_axis = '\0';
    pxVar3->_test = '\0';
    pxVar3->_left = pxVar5;
    pxVar3->_right = (xpath_ast_node *)0x0;
    pxVar3->_next = (xpath_ast_node *)0x0;
    return pxVar3;
  }
  pcVar11 = "Function has to be applied to node set";
  throw_error(this,"Function has to be applied to node set");
  ppxStack_58 = args;
  if (((xpath_ast_node *)pcVar11 != (xpath_ast_node *)0x0) &&
     (((xpath_ast_node *)pcVar11)->_rettype != '\x01')) goto LAB_0011f9f7;
  this_00 = &this->_lexer;
  lVar1 = (this->_lexer)._cur_lexeme;
  if (lVar1 == lex_double_dot) {
    xpath_lexer::next(this_00);
    pxVar3 = (xpath_ast_node *)alloc_node(this);
    pxVar3->_type = '8';
    pxVar3->_rettype = '\x01';
    pxVar3->_axis = '\t';
    pxVar3->_test = '\x02';
LAB_0011f657:
    pxVar3->_left = (xpath_ast_node *)pcVar11;
    pxVar3->_right = (xpath_ast_node *)0x0;
    pxVar3->_next = (xpath_ast_node *)0x0;
    (pxVar3->_data).string = (char_t *)0x0;
    return pxVar3;
  }
  if (lVar1 == lex_dot) {
    xpath_lexer::next(this_00);
    pxVar3 = (xpath_ast_node *)alloc_node(this);
    pxVar3->_type = '8';
    pxVar3->_rettype = '\x01';
    pxVar3->_axis = '\f';
    pxVar3->_test = '\x02';
    goto LAB_0011f657;
  }
  bVar14 = lVar1 != lex_axis_attribute;
  pcVar12 = pcVar11;
  if (bVar14) {
    cVar13 = '\x03';
  }
  else {
    xpath_lexer::next(this_00);
    lVar1 = (this->_lexer)._cur_lexeme;
    cVar13 = '\x02';
  }
  xStack_70.begin = (char_t *)0x0;
  xStack_70.end = (char_t *)0x0;
  if (lVar1 == lex_multiply) goto LAB_0011f6f7;
  if (lVar1 != lex_string) goto LAB_0011fa00;
  pxVar4 = xpath_lexer::contents(this_00);
  xStack_70.begin = pxVar4->begin;
  xStack_70.end = pxVar4->end;
  xpath_lexer::next(this_00);
  lVar1 = (this->_lexer)._cur_lexeme;
  if (lVar1 != lex_double_colon) goto LAB_0011f916;
  if (!bVar14) {
    pcVar11 = "Two axis specifiers in one step";
    goto LAB_0011f9ef;
  }
  cVar13 = *(char *)(xpath_memory_block **)xStack_70.begin;
  switch(cVar13) {
  case 'a':
    pcVar12 = "ancestor";
    bVar14 = xpath_lexer_string::operator==(&xStack_70,"ancestor");
    if (bVar14) {
      cVar13 = '\0';
    }
    else {
      pcVar12 = "ancestor-or-self";
      bVar14 = xpath_lexer_string::operator==(&xStack_70,"ancestor-or-self");
      cVar13 = '\x01';
      if (!bVar14) {
        pcVar12 = "attribute";
        bVar14 = xpath_lexer_string::operator==(&xStack_70,"attribute");
        cVar13 = '\x02';
        goto LAB_0011f8d4;
      }
    }
    break;
  case 'b':
  case 'e':
    goto switchD_0011f6d3_caseD_62;
  case 'c':
    pcVar12 = "child";
    bVar14 = xpath_lexer_string::operator==(&xStack_70,"child");
    cVar13 = '\x03';
    goto LAB_0011f8d4;
  case 'd':
    pcVar12 = "descendant";
    bVar14 = xpath_lexer_string::operator==(&xStack_70,"descendant");
    cVar13 = '\x04';
    if (!bVar14) {
      pcVar12 = "descendant-or-self";
      bVar14 = xpath_lexer_string::operator==(&xStack_70,"descendant-or-self");
      cVar13 = '\x05';
      goto LAB_0011f8d4;
    }
    break;
  case 'f':
    pcVar12 = "following";
    bVar14 = xpath_lexer_string::operator==(&xStack_70,"following");
    cVar13 = '\x06';
    if (!bVar14) {
      pcVar12 = "following-sibling";
      bVar14 = xpath_lexer_string::operator==(&xStack_70,"following-sibling");
      cVar13 = '\a';
      goto LAB_0011f8d4;
    }
    break;
  default:
    if (cVar13 == 'n') {
      pcVar12 = "namespace";
      bVar14 = xpath_lexer_string::operator==(&xStack_70,"namespace");
      cVar13 = '\b';
    }
    else {
      if (cVar13 == 'p') {
        pcVar12 = "parent";
        bVar14 = xpath_lexer_string::operator==(&xStack_70,"parent");
        cVar13 = '\t';
        if (!bVar14) {
          pcVar12 = "preceding";
          bVar14 = xpath_lexer_string::operator==(&xStack_70,"preceding");
          cVar13 = '\n';
          if (!bVar14) {
            pcVar12 = "preceding-sibling";
            bVar14 = xpath_lexer_string::operator==(&xStack_70,"preceding-sibling");
            cVar13 = '\v';
            goto LAB_0011f8d4;
          }
        }
        break;
      }
      if (cVar13 != 's') goto switchD_0011f6d3_caseD_62;
      pcVar12 = "self";
      bVar14 = xpath_lexer_string::operator==(&xStack_70,"self");
      cVar13 = '\f';
    }
LAB_0011f8d4:
    if (bVar14 == false) {
switchD_0011f6d3_caseD_62:
      pcVar11 = "Unknown axis";
      goto LAB_0011f9ef;
    }
  }
  xpath_lexer::next(this_00);
  lVar1 = (this->_lexer)._cur_lexeme;
  if (lVar1 == lex_multiply) {
LAB_0011f6f7:
    xStack_70.end = (char_t *)0x0;
    xStack_70.begin = (char_t *)0x0;
    xpath_lexer::next(this_00);
    cVar10 = '\a';
  }
  else {
    if (lVar1 != lex_string) {
LAB_0011fa00:
      pcVar11 = "Unrecognized node test";
      goto LAB_0011f9ef;
    }
    pxVar4 = xpath_lexer::contents(this_00);
    xStack_70.begin = pxVar4->begin;
    xStack_70.end = pxVar4->end;
    xpath_lexer::next(this_00);
    lVar1 = (this->_lexer)._cur_lexeme;
LAB_0011f916:
    if (lVar1 == lex_open_brace) {
      xpath_lexer::next(this_00);
      lVar1 = (this->_lexer)._cur_lexeme;
      if (lVar1 == lex_close_brace) {
        xpath_lexer::next(this_00);
        nVar2 = parse_node_test_type((xpath_parser *)&xStack_70,(xpath_lexer_string *)pcVar12);
        if (nVar2 == nodetest_none) {
          pcVar11 = "Unrecognized node type";
          goto LAB_0011f9ef;
        }
        cVar10 = (char)nVar2;
        xStack_70.begin = (char_t *)0x0;
        xStack_70.end = (char_t *)0x0;
      }
      else {
        bVar14 = xpath_lexer_string::operator==(&xStack_70,"processing-instruction");
        if (!bVar14) {
          pcVar11 = "Unmatched brace near node type test";
          goto LAB_0011f9ef;
        }
        if (lVar1 != lex_quoted_string) {
          pcVar11 = "Only literals are allowed as arguments to processing-instruction()";
          goto LAB_0011f9ef;
        }
        pxVar4 = xpath_lexer::contents(this_00);
        xStack_70.begin = pxVar4->begin;
        xStack_70.end = pxVar4->end;
        xpath_lexer::next(this_00);
        if ((this->_lexer)._cur_lexeme != lex_close_brace) {
          pcVar11 = "Unmatched brace near processing-instruction()";
          goto LAB_0011f9ef;
        }
        xpath_lexer::next(this_00);
        cVar10 = '\x06';
      }
    }
    else {
      cVar10 = '\x01';
      if (((2 < (long)xStack_70.end - (long)xStack_70.begin) && (xStack_70.end[-2] == ':')) &&
         (xStack_70.end[-1] == '*')) {
        xStack_70.end = xStack_70.end + -1;
        cVar10 = '\b';
      }
    }
  }
  pxVar5 = (xpath_ast_node *)alloc_node(this);
  pcVar6 = alloc_string(this,&xStack_70);
  pxVar5->_type = '8';
  pxVar5->_rettype = '\x01';
  pxVar5->_axis = cVar13;
  pxVar5->_test = cVar10;
  pxVar5->_left = (xpath_ast_node *)pcVar11;
  pxVar5->_right = (xpath_ast_node *)0x0;
  pxVar5->_next = (xpath_ast_node *)0x0;
  (pxVar5->_data).string = pcVar6;
  pxVar3 = (xpath_ast_node *)0x0;
  pxStack_60 = pxVar5;
  while( true ) {
    if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
      return pxStack_60;
    }
    xpath_lexer::next(this_00);
    pxVar7 = parse_expression(this);
    pxVar8 = (xpath_ast_node *)alloc_node(this);
    pxVar8->_type = '\x0f';
    pxVar8->_rettype = '\x01';
    pxVar8->_axis = '\0';
    pxVar8->_test = '\0';
    pxVar8->_left = pxVar7;
    pxVar8->_right = (xpath_ast_node *)0x0;
    pxVar8->_next = (xpath_ast_node *)0x0;
    if ((this->_lexer)._cur_lexeme != lex_close_square_brace) break;
    xpath_lexer::next(this_00);
    ppxVar9 = &pxVar3->_next;
    if (pxVar3 == (xpath_ast_node *)0x0) {
      ppxVar9 = &pxVar5->_right;
    }
    *ppxVar9 = pxVar8;
    pxVar3 = pxVar8;
  }
  pcVar11 = "Unmatched square brace";
LAB_0011f9ef:
  do {
    throw_error(this,pcVar11);
LAB_0011f9f7:
    pcVar11 = "Step has to be applied to node set";
  } while( true );
}

Assistant:

xpath_ast_node* parse_function_helper(ast_type_t type0, ast_type_t type1, size_t argc, xpath_ast_node* args[2])
		{
			assert(argc <= 1);

			if (argc == 1 && args[0]->rettype() != xpath_type_node_set) throw_error("Function has to be applied to node set");

			return new (alloc_node()) xpath_ast_node(argc == 0 ? type0 : type1, xpath_type_string, args[0]);
		}